

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int getopt_internal(int nargc,char **nargv,char *options,option *long_options,int *idx,int flags)

{
  char cVar1;
  int opt_end;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uint short_too;
  int iVar8;
  char *local_58;
  
  if (options == (char *)0x0) {
    return -1;
  }
  if (getopt_internal::posixly_correct == -1) {
    pcVar4 = getenv("POSIXLY_CORRECT");
    getopt_internal::posixly_correct = (int)(pcVar4 != (char *)0x0);
  }
  if (getopt_internal::posixly_correct == 0) {
    if (*options == '-') {
      flags = flags | 2;
    }
    else if (*options == '+') goto LAB_001042e7;
  }
  else {
LAB_001042e7:
    flags = flags & 0xfffffffe;
  }
  if ((*options == '-') || (local_58 = options, *options == '+')) {
    local_58 = options + 1;
  }
  if (optind == 0) {
    optreset = 1;
    optind = 1;
  }
  optarg = (char *)0x0;
  pcVar4 = place;
  iVar7 = nonopt_start;
  iVar8 = nonopt_end;
  if (optreset != 0) {
    nonopt_end = -1;
    nonopt_start = -1;
    iVar7 = nonopt_start;
    iVar8 = nonopt_end;
  }
  while ((iVar3 = nonopt_start, iVar2 = nonopt_end, opt_end = optind, optreset != 0 ||
         (*pcVar4 == '\0'))) {
    optreset = 0;
    if (nargc <= optind) {
      place = "";
      if (nonopt_end == -1) {
        if (nonopt_start == -1) {
          nonopt_end = -1;
          nonopt_start = -1;
          optreset = 0;
          return -1;
        }
      }
      else {
        permute_args(nonopt_start,nonopt_end,optind,nargv);
        nonopt_start = (iVar3 - iVar2) + optind;
      }
      optind = nonopt_start;
      nonopt_end = -1;
      nonopt_start = -1;
      return -1;
    }
    pcVar4 = nargv[optind];
    if ((*pcVar4 == '-') &&
       ((cVar1 = pcVar4[1], place = pcVar4, cVar1 != '\0' ||
        (pcVar5 = strchr(local_58,0x2d), pcVar5 != (char *)0x0)))) {
      iVar7 = nonopt_start;
      if ((nonopt_start != -1) && (nonopt_end == -1)) {
        nonopt_end = opt_end;
      }
      iVar8 = nonopt_end;
      if (((cVar1 != '\0') && (place = pcVar4 + 1, cVar1 == '-')) && (pcVar4[2] == '\0')) {
        optind = opt_end + 1;
        place = "";
        if (nonopt_end == -1) {
          nonopt_end = -1;
          nonopt_start = -1;
          return -1;
        }
        permute_args(nonopt_start,nonopt_end,optind,nargv);
        optind = optind + (iVar7 - iVar8);
        nonopt_end = -1;
        nonopt_start = -1;
        return -1;
      }
      break;
    }
    place = "";
    if ((flags & 2U) != 0) {
      optind = opt_end + 1;
      optarg = pcVar4;
      return 1;
    }
    if ((flags & 1U) == 0) {
      return -1;
    }
    if (iVar7 == -1) {
      nonopt_start = opt_end;
      iVar7 = opt_end;
    }
    else if (iVar8 != -1) {
      permute_args(iVar7,iVar8,opt_end,nargv);
      iVar7 = (iVar7 - iVar8) + optind;
      nonopt_end = -1;
      iVar8 = -1;
      nonopt_start = iVar7;
    }
    optind = optind + 1;
    pcVar4 = "";
  }
  if ((long_options != (option *)0x0) && (place != nargv[optind])) {
    cVar1 = *place;
    if ((flags & 4U) != 0 || cVar1 == 0x2d) {
      short_too = 0;
      if (cVar1 != ':') {
        if (cVar1 == '-') {
          place = place + 1;
        }
        else {
          pcVar4 = strchr(local_58,(int)cVar1);
          short_too = (uint)(pcVar4 != (char *)0x0);
        }
      }
      iVar7 = parse_long_options(nargv,local_58,long_options,idx,short_too);
      if (iVar7 != -1) {
        place = "";
        return iVar7;
      }
    }
  }
  pcVar4 = place + 1;
  cVar1 = *place;
  iVar7 = (int)cVar1;
  place = pcVar4;
  if (cVar1 != ':') {
    if (((cVar1 != '-') || (*pcVar4 == '\0')) &&
       (pcVar5 = strchr(local_58,iVar7), pcVar5 != (char *)0x0)) {
      if ((cVar1 == 'W' && long_options != (option *)0x0) && (pcVar5[1] == ';')) {
        if (*pcVar4 == '\0') {
          lVar6 = (long)optind;
          optind = optind + 1;
          if (nargc <= optind) {
            place = "";
            if ((opterr != 0) && (*local_58 != ':')) {
              warnx("option requires an argument -- %c",0x57);
            }
            optopt = 0x57;
            iVar7 = optopt;
LAB_00104825:
            optopt = iVar7;
            return (uint)(*local_58 != ':') * 5 + 0x3a;
          }
          place = nargv[lVar6 + 1];
        }
        iVar7 = parse_long_options(nargv,local_58,long_options,idx,0);
        place = "";
        return iVar7;
      }
      if (pcVar5[1] == ':') {
        optarg = (char *)0x0;
        if ((*pcVar4 == '\0') && (pcVar4 = optarg, pcVar5[2] != ':')) {
          lVar6 = (long)optind;
          optind = optind + 1;
          if (nargc <= optind) {
            place = "";
            if ((opterr != 0) && (*local_58 != ':')) {
              warnx("option requires an argument -- %c",iVar7);
            }
            goto LAB_00104825;
          }
          pcVar4 = nargv[lVar6 + 1];
        }
        optarg = pcVar4;
        place = "";
      }
      else if (*pcVar4 != '\0') {
        return iVar7;
      }
      optind = optind + 1;
      return iVar7;
    }
    if ((cVar1 == '-') && (*pcVar4 == '\0')) {
      return -1;
    }
  }
  if (*pcVar4 == '\0') {
    optind = optind + 1;
  }
  if ((opterr != 0) && (*local_58 != ':')) {
    warnx("unknown option -- %c",iVar7);
  }
  optopt = iVar7;
  return 0x3f;
}

Assistant:

static int
getopt_internal(int nargc, char * const * nargv, const char * options,
				const struct option * long_options, int * idx, int flags) {
	char * oli;				/* option letter list index */
	int optchar, short_too;
	static int posixly_correct = -1;

	if (options == NULL) {
		return (-1);
	}

	/*
	 * Disable GNU extensions if POSIXLY_CORRECT is set or options
	 * string begins with a '+'.
	 */
	if (posixly_correct == -1) {
		posixly_correct = (getenv("POSIXLY_CORRECT") != NULL);
	}

	if (posixly_correct || *options == '+') {
		flags &= ~FLAG_PERMUTE;
	} else if (*options == '-') {
		flags |= FLAG_ALLARGS;
	}

	if (*options == '+' || *options == '-') {
		options++;
	}

	/*
	 * XXX Some GNU programs (like cvs) set optind to 0 instead of
	 * XXX using optreset.  Work around this braindamage.
	 */
	if (optind == 0) {
		optind = optreset = 1;
	}

	optarg = NULL;

	if (optreset) {
		nonopt_start = nonopt_end = -1;
	}

start:

	if (optreset || !*place) {		/* update scanning pointer */
		optreset = 0;

		if (optind >= nargc) {          /* end of argument vector */
			place = EMSG;

			if (nonopt_end != -1) {
				/* do permutation, if we have to */
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			} else if (nonopt_start != -1) {
				/*
				 * If we skipped non-options, set optind
				 * to the first of them.
				 */
				optind = nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}

		if (*(place = nargv[optind]) != '-' ||
				(place[1] == '\0' && strchr(options, '-') == NULL)) {
			place = EMSG;		/* found non-option */

			if (flags & FLAG_ALLARGS) {
				/*
				 * GNU extension:
				 * return non-option as argument to option 1
				 */
				optarg = nargv[optind++];
				return (INORDER);
			}

			if (!(flags & FLAG_PERMUTE)) {
				/*
				 * If no permutation wanted, stop parsing
				 * at first non-option.
				 */
				return (-1);
			}

			/* do permutation */
			if (nonopt_start == -1) {
				nonopt_start = optind;
			} else if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				nonopt_start = optind -
							   (nonopt_end - nonopt_start);
				nonopt_end = -1;
			}

			optind++;
			/* process next argument */
			goto start;
		}

		if (nonopt_start != -1 && nonopt_end == -1) {
			nonopt_end = optind;
		}

		/*
		 * If we have "-" do nothing, if "--" we are done.
		 */
		if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
			optind++;
			place = EMSG;

			/*
			 * We found an option (--), so if we skipped
			 * non-options, we have to permute.
			 */
			if (nonopt_end != -1) {
				permute_args(nonopt_start, nonopt_end,
							 optind, nargv);
				optind -= nonopt_end - nonopt_start;
			}

			nonopt_start = nonopt_end = -1;
			return (-1);
		}
	}

	/*
	 * Check long options if:
	 *  1) we were passed some
	 *  2) the arg is not just "-"
	 *  3) either the arg starts with -- we are getopt_long_only()
	 */
	if (long_options != NULL && place != nargv[optind] &&
			(*place == '-' || (flags & FLAG_LONGONLY))) {
		short_too = 0;

		if (*place == '-') {
			place++;    /* --foo long option */
		} else if (*place != ':' && strchr(options, *place) != NULL) {
			short_too = 1;    /* could be short option too */
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, short_too);

		if (optchar != -1) {
			place = EMSG;
			return (optchar);
		}
	}

	if ((optchar = (int) * place++) == (int)':' ||
			(optchar == (int)'-' && *place != '\0') ||
			(oli = strchr(options, optchar)) == NULL) {
		/*
		 * If the user specified "-" and  '-' isn't listed in
		 * options, return -1 (non-option) as per POSIX.
		 * Otherwise, it is an unknown option character (or ':').
		 */
		if (optchar == (int)'-' && *place == '\0') {
			return (-1);
		}

		if (!*place) {
			++optind;
		}

		if (PRINT_ERROR) {
			warnx(illoptchar, optchar);
		}

		optopt = optchar;
		return (BADCH);
	}

	if (long_options != NULL && optchar == 'W' && oli[1] == ';') {
		/* -W long-option */
		if (*place)			/* no space */
			/* NOTHING */;
		else if (++optind >= nargc) {	/* no arg */
			place = EMSG;

			if (PRINT_ERROR) {
				warnx(recargchar, optchar);
			}

			optopt = optchar;
			return (BADARG);
		} else {			/* white space */
			place = nargv[optind];
		}

		optchar = parse_long_options(nargv, options, long_options,
									 idx, 0);
		place = EMSG;
		return (optchar);
	}

	if (*++oli != ':') {			/* doesn't take argument */
		if (!*place) {
			++optind;
		}
	} else {				/* takes (optional) argument */
		optarg = NULL;

		if (*place) {		/* no white space */
			optarg = place;
		} else if (oli[1] != ':') {	/* arg not optional */
			if (++optind >= nargc) {	/* no arg */
				place = EMSG;

				if (PRINT_ERROR) {
					warnx(recargchar, optchar);
				}

				optopt = optchar;
				return (BADARG);
			} else {
				optarg = nargv[optind];
			}
		}

		place = EMSG;
		++optind;
	}

	/* dump back option letter */
	return (optchar);
}